

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O0

int __thiscall mkvparser::MkvReader::Open(MkvReader *this,char *fileName)

{
  bool bVar1;
  FILE *pFVar2;
  char *in_RSI;
  long in_RDI;
  MkvReader *in_stack_ffffffffffffffd8;
  uint local_4;
  
  if (in_RSI == (char *)0x0) {
    local_4 = 0xffffffff;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    pFVar2 = fopen64(in_RSI,"rb");
    *(FILE **)(in_RDI + 0x10) = pFVar2;
    if (*(long *)(in_RDI + 0x10) == 0) {
      local_4 = 0xffffffff;
    }
    else {
      bVar1 = GetFileSize(in_stack_ffffffffffffffd8);
      local_4 = (uint)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int MkvReader::Open(const char* fileName) {
  if (fileName == NULL)
    return -1;

  if (m_file)
    return -1;

#ifdef _MSC_VER
  const errno_t e = fopen_s(&m_file, fileName, "rb");

  if (e)
    return -1;  // error
#else
  m_file = fopen(fileName, "rb");

  if (m_file == NULL)
    return -1;
#endif
  return !GetFileSize();
}